

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O2

void __thiscall MissingDependencyScanner::ProcessNode(MissingDependencyScanner *this,Node *node)

{
  Edge *this_00;
  Deps *pDVar1;
  pointer ppNVar2;
  pair<std::_Rb_tree_iterator<Node_*>,_bool> pVar3;
  DepfileParserOptions parser_opts;
  vector<Node_*,_std::allocator<Node_*>_> depfile_deps;
  string err;
  string deps_type;
  DepfileParserOptions local_b1;
  Node *local_b0;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_a8;
  string local_88;
  string local_68;
  undefined1 local_48 [32];
  DepfileParserOptions *local_28;
  _Vector_base<Node_*,_std::allocator<Node_*>_> *local_20;
  
  if ((node != (Node *)0x0) && (this_00 = node->in_edge_, this_00 != (Edge *)0x0)) {
    local_b0 = node;
    pVar3 = std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>
            ::_M_insert_unique<Node*const&>
                      ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>
                        *)&this->seen_,&local_b0);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      for (ppNVar2 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppNVar2 !=
          (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppNVar2 = ppNVar2 + 1) {
        ProcessNode(this,*ppNVar2);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_48,"deps",(allocator<char> *)&local_88);
      Edge::GetBinding(&local_68,this_00,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
      if (local_68._M_string_length == 0) {
        local_20 = &local_a8;
        local_a8._M_impl.super__Vector_impl_data._M_start = (Node **)0x0;
        local_a8._M_impl.super__Vector_impl_data._M_finish = (Node **)0x0;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48._24_8_ = this->deps_log_;
        local_48._8_8_ = this->state_;
        local_48._16_8_ = this->disk_interface_;
        local_28 = &local_b1;
        local_48._0_8_ = &PTR_ProcessDepfileDeps_00133bc0;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
        ImplicitDepLoader::LoadDeps((ImplicitDepLoader *)local_48,this_00,&local_88);
        if (local_a8._M_impl.super__Vector_impl_data._M_start !=
            local_a8._M_impl.super__Vector_impl_data._M_finish) {
          ProcessNodeDeps(this,local_b0,local_a8._M_impl.super__Vector_impl_data._M_start,
                          (int)((ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_a8._M_impl.super__Vector_impl_data._M_start) >> 3
                               ));
        }
        std::__cxx11::string::~string((string *)&local_88);
        std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_a8);
      }
      else {
        pDVar1 = DepsLog::GetDeps(this->deps_log_,local_b0);
        if (pDVar1 != (Deps *)0x0) {
          ProcessNodeDeps(this,local_b0,pDVar1->nodes,pDVar1->node_count);
        }
      }
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return;
}

Assistant:

void MissingDependencyScanner::ProcessNode(Node* node) {
  if (!node)
    return;
  Edge* edge = node->in_edge();
  if (!edge)
    return;
  if (!seen_.insert(node).second)
    return;

  for (std::vector<Node*>::iterator in = edge->inputs_.begin();
       in != edge->inputs_.end(); ++in) {
    ProcessNode(*in);
  }

  std::string deps_type = edge->GetBinding("deps");
  if (!deps_type.empty()) {
    DepsLog::Deps* deps = deps_log_->GetDeps(node);
    if (deps)
      ProcessNodeDeps(node, deps->nodes, deps->node_count);
  } else {
    DepfileParserOptions parser_opts;
    std::vector<Node*> depfile_deps;
    NodeStoringImplicitDepLoader dep_loader(state_, deps_log_, disk_interface_,
                                            &parser_opts, &depfile_deps);
    std::string err;
    dep_loader.LoadDeps(edge, &err);
    if (!depfile_deps.empty())
      ProcessNodeDeps(node, &depfile_deps[0], depfile_deps.size());
  }
}